

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nap_comm.cpp
# Opt level: O2

void standard_communication<int>
               (vector<int,_std::allocator<int>_> *send_vals,
               vector<int,_std::allocator<int>_> *recv_vals,int tag,MPI_Datatype mpi_type,
               MPIX_Data *send_data,MPIX_Data *recv_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> buf;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_50 = recv_vals;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)send_data->size_msgs,&local_51);
  lVar5 = 0;
  while (lVar5 < send_data->num_msgs) {
    piVar4 = (send_data->indptr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = (send_data->procs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    iVar2 = piVar4[lVar5];
    iVar3 = piVar4[lVar5 + 1];
    piVar4 = (send_vals->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar7 = (long)iVar2; lVar7 < iVar3; lVar7 = lVar7 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[lVar7] =
           piVar4[(send_data->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7]];
    }
    MPI_Isend(local_48._M_impl.super__Vector_impl_data._M_start + iVar2,iVar3 - iVar2,mpi_type,iVar1
              ,tag,&ompi_mpi_comm_world,
              (send_data->requests).
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_start + lVar5);
    lVar5 = lVar5 + 1;
  }
  lVar5 = 0;
  for (lVar7 = 0; uVar6 = (ulong)recv_data->num_msgs, lVar7 < (long)uVar6; lVar7 = lVar7 + 1) {
    piVar4 = (recv_data->indptr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[lVar7];
    MPI_Irecv((local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar1,piVar4[lVar7 + 1] - iVar1,mpi_type,
              (recv_data->procs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7],tag,&ompi_mpi_comm_world,
              lVar5 + (long)(recv_data->requests).
                            super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    lVar5 = lVar5 + 8;
  }
  if (send_data->num_msgs != 0) {
    MPI_Waitall(send_data->num_msgs,
                (send_data->requests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start,0);
    uVar6 = (ulong)(uint)recv_data->num_msgs;
  }
  if ((int)uVar6 != 0) {
    MPI_Waitall(uVar6,(recv_data->requests).
                      super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,0);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void standard_communication(std::vector<T>& send_vals, 
        std::vector<T>& recv_vals, int tag, MPI_Datatype mpi_type, 
        MPIX_Data* send_data, MPIX_Data* recv_data)
{
    int proc, start, end, idx;
    std::vector<T> buf(send_data->size_msgs);

    for (int i = 0; i < send_data->num_msgs; i++)
    {
        proc = send_data->procs[i];
        start = send_data->indptr[i];
        end = send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = send_data->indices[j];
            buf[j] = send_vals[idx];
        }
        MPI_Isend(&(buf[start]), end - start, mpi_type, proc, tag,
                MPI_COMM_WORLD, &send_data->requests[i]);
    }

    for (int i = 0; i < recv_data->num_msgs; i++)
    {
        proc = recv_data->procs[i];
        start = recv_data->indptr[i];
        end = recv_data->indptr[i+1];
        MPI_Irecv(&recv_vals[start], end - start, mpi_type, proc, tag, 
                MPI_COMM_WORLD, &recv_data->requests[i]);
    }
    
    if (send_data->num_msgs)
    {
        MPI_Waitall(send_data->num_msgs, send_data->requests.data(), 
                MPI_STATUSES_IGNORE);
    }
    if (recv_data->num_msgs)
    {
        MPI_Waitall(recv_data->num_msgs, recv_data->requests.data(), 
                MPI_STATUSES_IGNORE);
    }
}